

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SerialArena * __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArenaFallback(ThreadSafeArena *this,size_t n)

{
  anon_class_16_2_396affc0 fn;
  AllocationPolicy *policy_ptr;
  SizedPtr mem;
  SizedPtr SVar1;
  void *local_48;
  ThreadSafeArena *local_30;
  SerialArena *serial;
  void *id;
  size_t n_local;
  ThreadSafeArena *this_local;
  
  id = (void *)n;
  n_local = (size_t)this;
  serial = (SerialArena *)thread_cache();
  if (serial == (SerialArena *)this->first_owner_) {
    CacheSerialArena(this,&this->first_arena_);
    this_local = (ThreadSafeArena *)&this->first_arena_;
  }
  else {
    local_30 = (ThreadSafeArena *)0x0;
    fn.id = serial;
    fn.serial = (SerialArena **)&local_30;
    WalkConstSerialArenaChunk<google::protobuf::internal::ThreadSafeArena::GetSerialArenaFallback(unsigned_long)::__0>
              (this,fn);
    if (local_30 == (ThreadSafeArena *)0x0) {
      policy_ptr = TaggedAllocationPolicyPtr::get(&this->alloc_policy_);
      SVar1 = anon_unknown_12::AllocateBlock(policy_ptr,0,(long)id + 0x78);
      local_48 = (void *)SVar1.n;
      mem.n = (size_t)this;
      mem.p = local_48;
      local_30 = (ThreadSafeArena *)
                 SerialArena::New((SerialArena *)SVar1.p,mem,(ThreadSafeArena *)SVar1.p);
      AddSerialArena(this,serial,(SerialArena *)local_30);
    }
    CacheSerialArena(this,(SerialArena *)local_30);
    this_local = local_30;
  }
  return (SerialArena *)this_local;
}

Assistant:

PROTOBUF_NOINLINE
SerialArena* ThreadSafeArena::GetSerialArenaFallback(size_t n) {
  void* const id = &thread_cache();
  if (id == first_owner_) {
    CacheSerialArena(&first_arena_);
    return &first_arena_;
  }

  // Search matching SerialArena.
  SerialArena* serial = nullptr;
  WalkConstSerialArenaChunk([&serial, id](const SerialArenaChunk* chunk) {
    absl::Span<const std::atomic<void*>> ids = chunk->ids();
    for (uint32_t i = 0; i < ids.size(); ++i) {
      if (ids[i].load(std::memory_order_relaxed) == id) {
        serial = chunk->arena(i).load(std::memory_order_relaxed);
        ABSL_DCHECK_NE(serial, nullptr);
        break;
      }
    }
  });

  if (!serial) {
    // This thread doesn't have any SerialArena, which also means it doesn't
    // have any blocks yet.  So we'll allocate its first block now. It must be
    // big enough to host SerialArena and the pending request.
    serial = SerialArena::New(
        AllocateBlock(alloc_policy_.get(), 0, n + kSerialArenaSize), *this);

    AddSerialArena(id, serial);
  }

  CacheSerialArena(serial);
  return serial;
}